

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_stdio.c
# Opt level: O0

err_t GetTty(stdio_stream *p,dataid Id,bool_t *Value,size_t Size)

{
  int iVar1;
  size_t Size_local;
  bool_t *Value_local;
  dataid Id_local;
  stdio_stream *p_local;
  
  iVar1 = fileno((FILE *)p->Stream);
  iVar1 = isatty(iVar1);
  *Value = (long)(int)(uint)(iVar1 != 0);
  return 0;
}

Assistant:

static err_t GetTty(stdio_stream *p, dataid UNUSED_PARAM(Id), bool_t *Value, size_t UNUSED_PARAM(Size))
{
#if defined(TARGET_WIN)
    *Value = _isatty(_fileno(p->Stream))!=0;
#else
    *Value = isatty(fileno(p->Stream))!=0;
#endif
    return ERR_NONE;
}